

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGPtr xmlRelaxNGParse(xmlRelaxNGParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  xmlDocPtr doc_00;
  xmlNodePtr node;
  xmlRelaxNGDefinePtr_conflict pxVar2;
  xmlChar *local_50;
  xmlRelaxNGDefinePtr_conflict def;
  xmlNodePtr root;
  xmlDocPtr doc;
  xmlRelaxNGPtr ret;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  xmlRelaxNGInitTypes();
  if (ctxt == (xmlRelaxNGParserCtxtPtr)0x0) {
    ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
  }
  else {
    if (ctxt->URL == (xmlChar *)0x0) {
      if (ctxt->buffer == (char *)0x0) {
        if (ctxt->document == (xmlDocPtr)0x0) {
          xmlRngPErr(ctxt,(xmlNodePtr)0x0,0x3fe,"xmlRelaxNGParse: nothing to parse\n",(xmlChar *)0x0
                     ,(xmlChar *)0x0);
          return (xmlRelaxNGPtr)0x0;
        }
        root = (xmlNodePtr)ctxt->document;
      }
      else {
        root = (xmlNodePtr)xmlRelaxReadMemory(ctxt,ctxt->buffer,ctxt->size);
        if ((xmlDoc *)root == (xmlDoc *)0x0) {
          xmlRngPErr(ctxt,(xmlNodePtr)0x0,0x429,"xmlRelaxNGParse: could not parse schemas\n",
                     (xmlChar *)0x0,(xmlChar *)0x0);
          return (xmlRelaxNGPtr)0x0;
        }
        pxVar1 = xmlStrdup((xmlChar *)"in_memory_buffer");
        ((xmlDoc *)root)->URL = pxVar1;
        pxVar1 = xmlStrdup((xmlChar *)"in_memory_buffer");
        ctxt->URL = pxVar1;
      }
    }
    else {
      root = (xmlNodePtr)xmlRelaxReadFile(ctxt,(char *)ctxt->URL);
      if ((xmlDoc *)root == (xmlDoc *)0x0) {
        xmlRngPErr(ctxt,(xmlNodePtr)0x0,0x429,"xmlRelaxNGParse: could not load %s\n",ctxt->URL,
                   (xmlChar *)0x0);
        return (xmlRelaxNGPtr)0x0;
      }
    }
    ctxt->document = (xmlDocPtr)root;
    doc_00 = xmlRelaxNGCleanupDoc(ctxt,(xmlDocPtr)root);
    if (doc_00 == (xmlDocPtr)0x0) {
      xmlFreeDoc(ctxt->document);
      ctxt->document = (xmlDocPtr)0x0;
      ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
    }
    else {
      node = xmlDocGetRootElement(doc_00);
      if (node == (xmlNodePtr)0x0) {
        if (ctxt->URL == (xmlChar *)0x0) {
          local_50 = "schemas";
        }
        else {
          local_50 = ctxt->URL;
        }
        xmlRngPErr(ctxt,(xmlNodePtr)doc_00,0x3fe,"xmlRelaxNGParse: %s is empty\n",local_50,
                   (xmlChar *)0x0);
        xmlFreeDoc(ctxt->document);
        ctxt->document = (xmlDocPtr)0x0;
        ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
      }
      else {
        ctxt_local = (xmlRelaxNGParserCtxtPtr)xmlRelaxNGParseDocument(ctxt,node);
        if (ctxt_local == (xmlRelaxNGParserCtxtPtr)0x0) {
          xmlFreeDoc(ctxt->document);
          ctxt->document = (xmlDocPtr)0x0;
          ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
        }
        else {
          if (ctxt->interleaves != (xmlHashTablePtr)0x0) {
            xmlHashScan(ctxt->interleaves,xmlRelaxNGComputeInterleaves,ctxt);
          }
          if (ctxt->nbErrors < 1) {
            if (((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error !=
                 (xmlRelaxNGGrammarPtr_conflict)0x0) &&
               (((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error)->start !=
                (xmlRelaxNGDefinePtr_conflict)0x0)) {
              if ((((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error)->start->type !=
                   XML_RELAXNG_START) &&
                 (pxVar2 = xmlRelaxNGNewDefine(ctxt,(xmlNodePtr)0x0),
                 pxVar2 != (xmlRelaxNGDefinePtr_conflict)0x0)) {
                pxVar2->type = XML_RELAXNG_START;
                pxVar2->content = ((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error)->start;
                ((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error)->start = pxVar2;
              }
              xmlRelaxNGTryCompile(ctxt,((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error)->start);
            }
            ctxt_local->warning = (xmlRelaxNGValidityWarningFunc)doc_00;
            ctxt->document = (xmlDocPtr)0x0;
            ctxt_local->grammar = (xmlRelaxNGGrammarPtr_conflict)ctxt->documents;
            ctxt->documents = (xmlRelaxNGDocumentPtr_conflict)0x0;
            ctxt_local->parentgrammar = (xmlRelaxNGGrammarPtr_conflict)ctxt->includes;
            ctxt->includes = (xmlRelaxNGIncludePtr_conflict)0x0;
            ctxt_local->flags = ctxt->defNr;
            *(xmlRelaxNGDefinePtr_conflict **)&ctxt_local->nbWarnings = ctxt->defTab;
            ctxt->defTab = (xmlRelaxNGDefinePtr_conflict *)0x0;
            if (ctxt->idref == 1) {
              *(int *)&ctxt_local->serror = 1;
            }
          }
          else {
            xmlRelaxNGFree((xmlRelaxNGPtr)ctxt_local);
            ctxt->document = (xmlDocPtr)0x0;
            xmlFreeDoc(doc_00);
            ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
          }
        }
      }
    }
  }
  return (xmlRelaxNGPtr)ctxt_local;
}

Assistant:

xmlRelaxNGPtr
xmlRelaxNGParse(xmlRelaxNGParserCtxtPtr ctxt)
{
    xmlRelaxNGPtr ret = NULL;
    xmlDocPtr doc;
    xmlNodePtr root;

    xmlRelaxNGInitTypes();

    if (ctxt == NULL)
        return (NULL);

    /*
     * First step is to parse the input document into an DOM/Infoset
     */
    if (ctxt->URL != NULL) {
        doc = xmlRelaxReadFile(ctxt, (const char *) ctxt->URL);
        if (doc == NULL) {
            xmlRngPErr(ctxt, NULL, XML_RNGP_PARSE_ERROR,
                       "xmlRelaxNGParse: could not load %s\n", ctxt->URL,
                       NULL);
            return (NULL);
        }
    } else if (ctxt->buffer != NULL) {
        doc = xmlRelaxReadMemory(ctxt, ctxt->buffer, ctxt->size);
        if (doc == NULL) {
            xmlRngPErr(ctxt, NULL, XML_RNGP_PARSE_ERROR,
                       "xmlRelaxNGParse: could not parse schemas\n", NULL,
                       NULL);
            return (NULL);
        }
        doc->URL = xmlStrdup(BAD_CAST "in_memory_buffer");
        ctxt->URL = xmlStrdup(BAD_CAST "in_memory_buffer");
    } else if (ctxt->document != NULL) {
        doc = ctxt->document;
    } else {
        xmlRngPErr(ctxt, NULL, XML_RNGP_EMPTY,
                   "xmlRelaxNGParse: nothing to parse\n", NULL, NULL);
        return (NULL);
    }
    ctxt->document = doc;

    /*
     * Some preprocessing of the document content
     */
    doc = xmlRelaxNGCleanupDoc(ctxt, doc);
    if (doc == NULL) {
        xmlFreeDoc(ctxt->document);
        ctxt->document = NULL;
        return (NULL);
    }

    /*
     * Then do the parsing for good
     */
    root = xmlDocGetRootElement(doc);
    if (root == NULL) {
        xmlRngPErr(ctxt, (xmlNodePtr) doc,
	           XML_RNGP_EMPTY, "xmlRelaxNGParse: %s is empty\n",
                   (ctxt->URL ? ctxt->URL : BAD_CAST "schemas"), NULL);

        xmlFreeDoc(ctxt->document);
        ctxt->document = NULL;
        return (NULL);
    }
    ret = xmlRelaxNGParseDocument(ctxt, root);
    if (ret == NULL) {
        xmlFreeDoc(ctxt->document);
        ctxt->document = NULL;
        return (NULL);
    }

    /*
     * Check the ref/defines links
     */
    /*
     * try to preprocess interleaves
     */
    if (ctxt->interleaves != NULL) {
        xmlHashScan(ctxt->interleaves, xmlRelaxNGComputeInterleaves, ctxt);
    }

    /*
     * if there was a parsing error return NULL
     */
    if (ctxt->nbErrors > 0) {
        xmlRelaxNGFree(ret);
        ctxt->document = NULL;
        xmlFreeDoc(doc);
        return (NULL);
    }

    /*
     * try to compile (parts of) the schemas
     */
    if ((ret->topgrammar != NULL) && (ret->topgrammar->start != NULL)) {
        if (ret->topgrammar->start->type != XML_RELAXNG_START) {
            xmlRelaxNGDefinePtr def;

            def = xmlRelaxNGNewDefine(ctxt, NULL);
            if (def != NULL) {
                def->type = XML_RELAXNG_START;
                def->content = ret->topgrammar->start;
                ret->topgrammar->start = def;
            }
        }
        xmlRelaxNGTryCompile(ctxt, ret->topgrammar->start);
    }

    /*
     * Transfer the pointer for cleanup at the schema level.
     */
    ret->doc = doc;
    ctxt->document = NULL;
    ret->documents = ctxt->documents;
    ctxt->documents = NULL;

    ret->includes = ctxt->includes;
    ctxt->includes = NULL;
    ret->defNr = ctxt->defNr;
    ret->defTab = ctxt->defTab;
    ctxt->defTab = NULL;
    if (ctxt->idref == 1)
        ret->idref = 1;

    return (ret);
}